

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_tests.hpp
# Opt level: O2

string * __thiscall
iuutil::TestSuiteNameRemoveInstantiateAndIndexName_abi_cxx11_
          (string *__return_storage_ptr__,iuutil *this,char *name)

{
  char *pcVar1;
  char *pcVar2;
  char *name_00;
  char *name_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  pcVar1 = strrchr((char *)this,0x2e);
  pcVar2 = strchr((char *)this,0x2f);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)this,(allocator<char> *)&local_60);
  }
  else if (pcVar1 == (char *)0x0) {
    TestNameRemoveIndexName_abi_cxx11_(__return_storage_ptr__,(iuutil *)(pcVar2 + 1),name_00);
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,this,pcVar1 + 1);
    TestNameRemoveIndexName_abi_cxx11_(&local_40,(iuutil *)(pcVar2 + 1),name_01);
    std::operator+(__return_storage_ptr__,&local_60,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string TestSuiteNameRemoveInstantiateAndIndexName(const char* name)
{
    // パッケージ名があれば取得
    const char* const pkg = strrchr(name, '.');
    // 先頭にインスタンス名がある
    const char* const p1 = strchr(name, '/');
    if( p1 == NULL )
    {
        return name;
    }
    if( pkg == NULL )
    {
        return TestSuiteNameRemoveIndexName(p1 + 1);
    }
    else
    {
        return ::std::string(name, pkg + 1) + TestSuiteNameRemoveIndexName(p1 + 1);
    }
}